

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

string * __thiscall cmGeneratorTarget::GetExportMacro_abi_cxx11_(cmGeneratorTarget *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  pointer pcVar3;
  bool bVar4;
  TargetType TVar5;
  char *__s;
  string *psVar6;
  string in;
  string local_60;
  string local_40;
  
  TVar5 = cmTarget::GetType(this->Target);
  if (((TVar5 != SHARED_LIBRARY) &&
      (TVar5 = cmTarget::GetType(this->Target), TVar5 != MODULE_LIBRARY)) &&
     (bVar4 = IsExecutableWithExports(this), !bVar4)) {
    return (string *)0x0;
  }
  paVar1 = &local_60.field_2;
  local_60._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"DEFINE_SYMBOL","");
  __s = GetProperty(this,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if (__s == (char *)0x0) {
    psVar6 = cmTarget::GetName_abi_cxx11_(this->Target);
    pcVar3 = (psVar6->_M_dataplus)._M_p;
    local_60._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_60,pcVar3,pcVar3 + psVar6->_M_string_length);
    std::__cxx11::string::append((char *)&local_60);
    cmsys::SystemTools::MakeCidentifier(&local_40,&local_60);
    std::__cxx11::string::operator=((string *)&this->ExportMacro,(string *)&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != paVar1) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    pcVar2 = (char *)(this->ExportMacro)._M_string_length;
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)&this->ExportMacro,0,pcVar2,(ulong)__s);
  }
  return &this->ExportMacro;
}

Assistant:

const std::string* cmGeneratorTarget::GetExportMacro() const
{
  // Define the symbol for targets that export symbols.
  if (this->GetType() == cmStateEnums::SHARED_LIBRARY ||
      this->GetType() == cmStateEnums::MODULE_LIBRARY ||
      this->IsExecutableWithExports()) {
    if (const char* custom_export_name = this->GetProperty("DEFINE_SYMBOL")) {
      this->ExportMacro = custom_export_name;
    } else {
      std::string in = this->GetName();
      in += "_EXPORTS";
      this->ExportMacro = cmSystemTools::MakeCidentifier(in);
    }
    return &this->ExportMacro;
  }
  return nullptr;
}